

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O0

int Abc_NtkConvertToBlifMv(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  int local_6c;
  int local_68;
  int k;
  int i;
  int nSize;
  int nCubes;
  int Value;
  char *pCur;
  char *pCube;
  char *pBlifMv;
  char *pSop1;
  char *pSop0;
  Vec_Str_t *vCube;
  Abc_Obj_t *pNode;
  Mem_Flex_t *pMmFlex;
  Abc_Ntk_t *pNtk_local;
  
  pMmFlex = (Mem_Flex_t *)pNtk;
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x3c6,"int Abc_NtkConvertToBlifMv(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkToBdd((Abc_Ntk_t *)pMmFlex);
  if (iVar1 == 0) {
    printf("Converting logic functions to BDDs has failed.\n");
    pNtk_local._4_4_ = 0;
  }
  else {
    pNode = (Abc_Obj_t *)Mem_FlexStart();
    pSop0 = (char *)Vec_StrAlloc(100);
    for (local_68 = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)&pMmFlex->nChunks), local_68 < iVar1;
        local_68 = local_68 + 1) {
      vCube = (Vec_Str_t *)Abc_NtkObj((Abc_Ntk_t *)pMmFlex,local_68);
      if (((Abc_Obj_t *)vCube != (Abc_Obj_t *)0x0) &&
         (iVar1 = Abc_ObjIsNode((Abc_Obj_t *)vCube), iVar1 != 0)) {
        Abc_NodeBddToCnf((Abc_Obj_t *)vCube,(Mem_Flex_t *)pNode,(Vec_Str_t *)pSop0,0,&pSop1,&pBlifMv
                        );
        iVar1 = Abc_SopGetCubeNum(pSop1);
        iVar2 = Abc_SopGetCubeNum(pBlifMv);
        iVar3 = Abc_ObjFaninNum((Abc_Obj_t *)vCube);
        iVar1 = (iVar1 + iVar2) * (iVar3 * 2 + 2) + 1;
        pcVar4 = Mem_FlexEntryFetch((Mem_Flex_t *)pNode,iVar1);
        _nCubes = pcVar4;
        for (pCur = pSop1; *pCur != '\0'; pCur = pCur + (iVar2 + 3)) {
          local_6c = 0;
          while( true ) {
            bVar6 = false;
            if (pCur[local_6c] != ' ') {
              nSize = (int)pCur[local_6c];
              bVar6 = nSize != 0;
            }
            if (!bVar6) break;
            pcVar5 = _nCubes + 1;
            *_nCubes = (char)nSize;
            _nCubes = _nCubes + 2;
            *pcVar5 = ' ';
            local_6c = local_6c + 1;
          }
          pcVar5 = _nCubes + 1;
          *_nCubes = '0';
          _nCubes = _nCubes + 2;
          *pcVar5 = '\n';
          iVar2 = Abc_ObjFaninNum((Abc_Obj_t *)vCube);
        }
        for (pCur = pBlifMv; *pCur != '\0'; pCur = pCur + (iVar2 + 3)) {
          local_6c = 0;
          while( true ) {
            bVar6 = false;
            if (pCur[local_6c] != ' ') {
              nSize = (int)pCur[local_6c];
              bVar6 = nSize != 0;
            }
            if (!bVar6) break;
            pcVar5 = _nCubes + 1;
            *_nCubes = (char)nSize;
            _nCubes = _nCubes + 2;
            *pcVar5 = ' ';
            local_6c = local_6c + 1;
          }
          pcVar5 = _nCubes + 1;
          *_nCubes = '1';
          _nCubes = _nCubes + 2;
          *pcVar5 = '\n';
          iVar2 = Abc_ObjFaninNum((Abc_Obj_t *)vCube);
        }
        *_nCubes = '\0';
        if (_nCubes + (1 - (long)pcVar4) != (char *)(long)iVar1) {
          __assert_fail("pCur - pBlifMv == nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                        ,0x3ee,"int Abc_NtkConvertToBlifMv(Abc_Ntk_t *)");
        }
        Cudd_RecursiveDeref(*(DdManager **)&pMmFlex[4].nChunks,(DdNode *)vCube[3].pArray);
        vCube[3].pArray = pcVar4;
      }
    }
    *(undefined4 *)&pMmFlex->field_0x4 = 5;
    Cudd_Quit(*(DdManager **)&pMmFlex[4].nChunks);
    *(Abc_Obj_t **)&pMmFlex[4].nChunks = pNode;
    Vec_StrFree((Vec_Str_t *)pSop0);
    pNtk_local._4_4_ = 1;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkConvertToBlifMv( Abc_Ntk_t * pNtk )
{
#ifdef ABC_USE_CUDD
    Mem_Flex_t * pMmFlex;
    Abc_Obj_t * pNode;
    Vec_Str_t * vCube;
    char * pSop0, * pSop1, * pBlifMv, * pCube, * pCur;
    int Value, nCubes, nSize, i, k;

    assert( Abc_NtkIsNetlist(pNtk) );
    if ( !Abc_NtkToBdd(pNtk) )
    {
        printf( "Converting logic functions to BDDs has failed.\n" );
        return 0;
    }

    pMmFlex = Mem_FlexStart();
    vCube   = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // convert BDD into cubes for on-set and off-set
        Abc_NodeBddToCnf( pNode, pMmFlex, vCube, 0, &pSop0, &pSop1 );
        // allocate room for the MV-SOP
        nCubes = Abc_SopGetCubeNum(pSop0) + Abc_SopGetCubeNum(pSop1);
        nSize = nCubes*(2*Abc_ObjFaninNum(pNode) + 2)+1;
        pBlifMv = Mem_FlexEntryFetch( pMmFlex, nSize );
        // add the cubes
        pCur = pBlifMv;
        Abc_SopForEachCube( pSop0, Abc_ObjFaninNum(pNode), pCube )
        {
            Abc_CubeForEachVar( pCube, Value, k )
            {
                *pCur++ = Value;
                *pCur++ = ' ';
            }
            *pCur++ = '0';
            *pCur++ = '\n';
        }
        Abc_SopForEachCube( pSop1, Abc_ObjFaninNum(pNode), pCube )
        {
            Abc_CubeForEachVar( pCube, Value, k )
            {
                *pCur++ = Value;
                *pCur++ = ' ';
            }
            *pCur++ = '1';
            *pCur++ = '\n';
        }
        *pCur++ = 0;
        assert( pCur - pBlifMv == nSize );
        // update the node representation
        Cudd_RecursiveDeref( (DdManager *)pNtk->pManFunc, (DdNode *)pNode->pData );
        pNode->pData = pBlifMv;
    }

    // update the functionality type
    pNtk->ntkFunc = ABC_FUNC_BLIFMV;
    Cudd_Quit( (DdManager *)pNtk->pManFunc );
    pNtk->pManFunc = pMmFlex;

    Vec_StrFree( vCube );
#endif
    return 1;
}